

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximp.cpp
# Opt level: O2

UChar32 __thiscall icu_63::CaseFoldingUCharIterator::next(CaseFoldingUCharIterator *this)

{
  UChar **pString;
  UChar UVar1;
  UChar UVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  UChar *pUVar6;
  uint uVar7;
  int32_t iVar8;
  uint uVar9;
  
  pString = &this->fFoldChars;
  pUVar6 = this->fFoldChars;
  if (pUVar6 == (UChar *)0x0) {
    lVar3 = this->fIndex;
    if (this->fLimit <= lVar3) {
      return -1;
    }
    this->fIndex = lVar3 + 1;
    UVar1 = this->fChars[lVar3];
    uVar7 = (uint)(ushort)UVar1;
    if ((lVar3 + 1 != this->fLimit && (UVar1 & 0xfc00U) == 0xd800) &&
       (uVar9 = (uint)(ushort)this->fChars[lVar3 + 1], (uVar9 & 0xfc00) == 0xdc00)) {
      this->fIndex = lVar3 + 2;
      uVar7 = (uint)(ushort)UVar1 * 0x400 + uVar9 + 0xfca02400;
    }
    iVar8 = 0;
    uVar7 = ucase_toFullFolding_63(uVar7,pString,0);
    this->fFoldLength = uVar7;
    if (0x1e < uVar7) {
      if ((int)uVar7 < 0) {
        uVar7 = ~uVar7;
        this->fFoldLength = uVar7;
      }
      goto LAB_0026ac33;
    }
    pUVar6 = *pString;
  }
  else {
    uVar7 = this->fFoldLength;
    iVar8 = this->fFoldIndex;
  }
  uVar9 = iVar8 + 1;
  this->fFoldIndex = uVar9;
  UVar1 = pUVar6[iVar8];
  uVar5 = (uint)(ushort)UVar1;
  if ((((UVar1 & 0xfc00U) == 0xd800) && (uVar9 != uVar7)) &&
     (UVar2 = pUVar6[(int)uVar9], ((ushort)UVar2 & 0xfc00) == 0xdc00)) {
    uVar9 = iVar8 + 2;
    this->fFoldIndex = uVar9;
    uVar5 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + 0xfca02400;
  }
  bVar4 = (int)uVar9 < (int)uVar7;
  uVar7 = uVar5;
  if (bVar4) {
    return uVar5;
  }
LAB_0026ac33:
  *pString = (UChar *)0x0;
  return uVar7;
}

Assistant:

UChar32 CaseFoldingUCharIterator::next() {
    UChar32  foldedC;
    UChar32  originalC;
    if (fFoldChars == NULL) {
        // We are not in a string folding of an earlier character.
        // Start handling the next char from the input UText.
        if (fIndex >= fLimit) {
            return U_SENTINEL;
        }
        U16_NEXT(fChars, fIndex, fLimit, originalC);

        fFoldLength = ucase_toFullFolding(originalC, &fFoldChars, U_FOLD_CASE_DEFAULT);
        if (fFoldLength >= UCASE_MAX_STRING_LENGTH || fFoldLength < 0) {
            // input code point folds to a single code point, possibly itself.
            // See comment in ucase.h for explanation of return values from ucase_toFullFoldings.
            if (fFoldLength < 0) {
                fFoldLength = ~fFoldLength;
            }
            foldedC = (UChar32)fFoldLength;
            fFoldChars = NULL;
            return foldedC;
        }
        // String foldings fall through here.
        fFoldIndex = 0;
    }

    U16_NEXT(fFoldChars, fFoldIndex, fFoldLength, foldedC);
    if (fFoldIndex >= fFoldLength) {
        fFoldChars = NULL;
    }
    return foldedC;
}